

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

int __thiscall
CVmDynamicFunc::getp_get_source(CVmDynamicFunc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  int iVar3;
  
  if (getp_get_source(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_source();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_source::desc);
  if (iVar3 == 0) {
    pcVar1 = (this->super_CVmObject).ext_;
    aVar2 = *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 8);
    *(undefined8 *)retval = *(undefined8 *)pcVar1;
    retval->val = aVar2;
  }
  return 1;
}

Assistant:

int CVmDynamicFunc::getp_get_source(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the source code object */
    *retval = get_ext()->src;

    /* handled */
    return TRUE;
}